

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::detail::MessageBuilder::~MessageBuilder(MessageBuilder *this)

{
  String local_28;
  MessageBuilder *local_10;
  MessageBuilder *this_local;
  
  local_10 = this;
  if ((this->logged & 1U) == 0) {
    tlssPop();
    String::~String(&local_28);
  }
  MessageData::~MessageData(&this->super_MessageData);
  return;
}

Assistant:

MessageBuilder::~MessageBuilder() {
        if (!logged)
            tlssPop();
    }